

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsvg.c
# Opt level: O3

FT_Error tt_face_load_svg_doc(FT_GlyphSlot glyph,FT_UInt glyph_index)

{
  FT_UInt *pFVar1;
  FT_Size pFVar2;
  undefined8 uVar3;
  FT_Fixed FVar4;
  FT_Fixed FVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  FT_UShort FVar8;
  FT_Memory memory;
  FT_Error FVar9;
  uint uVar10;
  FT_Byte *output;
  ulong uVar11;
  uint uVar12;
  FT_Byte *pFVar13;
  uint uVar14;
  uint uVar15;
  FT_ULong uncomp_size;
  FT_Error local_7c;
  long local_78;
  Svg_doc local_70;
  FT_GlyphSlot local_58;
  FT_Face local_50;
  FT_Memory local_48;
  undefined8 *local_40;
  void *local_38;
  
  local_50 = glyph->face;
  local_38 = local_50[5].extensions;
  FVar9 = 8;
  if (*(ushort *)((long)local_38 + 2) != 0) {
    local_40 = (undefined8 *)glyph->other;
    local_48 = local_50->memory;
    local_78 = *(long *)((long)local_38 + 8);
    pFVar13 = (FT_Byte *)(local_78 + 2);
    uVar12 = *(ushort *)((long)local_38 + 2) - 1;
    extract_svg_doc(&local_70,pFVar13);
    FVar8 = local_70.start_glyph_id;
    extract_svg_doc(&local_70,pFVar13 + uVar12 * 0xc);
    if ((FVar8 <= glyph_index) &&
       ((glyph_index < local_70.start_glyph_id || (glyph_index <= local_70.end_glyph_id)))) {
      uVar15 = 0;
      local_58 = glyph;
      do {
        uVar14 = uVar15 + uVar12 >> 1;
        extract_svg_doc(&local_70,pFVar13 + uVar14 * 0xc);
        memory = local_48;
        FVar8 = local_70.end_glyph_id;
        uVar10 = (uint)(local_70.end_glyph_id < glyph_index);
        if (glyph_index < local_70.start_glyph_id) {
          uVar10 = 0xffffffff;
        }
        if (uVar10 == 0xffffffff) {
          uVar12 = uVar14 - 1;
        }
        else {
          if (uVar10 != 1) {
            local_7c = 0;
            uVar11 = (*(long *)((long)local_38 + 0x10) - local_78) +
                     *(long *)((long)local_38 + 0x18);
            if (uVar11 - local_70.offset < local_70.length || uVar11 < local_70.offset) {
              return 8;
            }
            pFVar13 = (FT_Byte *)(local_78 + local_70.offset);
            if ((((6 < local_70.length) && (*pFVar13 == '\x1f')) && (pFVar13[1] == 0x8b)) &&
               (pFVar13[2] == '\b')) {
              local_78 = CONCAT44(local_78._4_4_,(uint)local_70.start_glyph_id);
              local_70._0_8_ = ZEXT48(*(uint *)(pFVar13 + (local_70.length - 4)));
              output = (FT_Byte *)ft_mem_qalloc(local_48,local_70._0_8_,&local_7c);
              if (local_7c != 0) {
                return local_7c;
              }
              local_7c = FT_Gzip_Uncompress(memory,output,(FT_ULong *)&local_70,pFVar13,
                                            local_70.length);
              if (local_7c != 0) {
                ft_mem_free(memory,output);
                return 8;
              }
              pFVar1 = &local_58->internal->flags;
              *pFVar1 = *pFVar1 | 2;
              local_50 = local_58->face;
              local_70.length = local_70._0_8_;
              pFVar13 = output;
              local_70.start_glyph_id = (ushort)local_78;
            }
            *local_40 = pFVar13;
            local_40[1] = local_70.length;
            pFVar2 = local_50->size;
            local_40[8] = (pFVar2->metrics).max_advance;
            uVar3 = *(undefined8 *)&pFVar2->metrics;
            FVar4 = (pFVar2->metrics).x_scale;
            FVar5 = (pFVar2->metrics).y_scale;
            FVar6 = (pFVar2->metrics).ascender;
            FVar7 = (pFVar2->metrics).height;
            local_40[6] = (pFVar2->metrics).descender;
            local_40[7] = FVar7;
            local_40[4] = FVar5;
            local_40[5] = FVar6;
            local_40[2] = uVar3;
            local_40[3] = FVar4;
            *(FT_UShort *)(local_40 + 9) = local_58->face->units_per_EM;
            *(FT_UShort *)((long)local_40 + 0x4a) = local_70.start_glyph_id;
            *(FT_UShort *)((long)local_40 + 0x4c) = FVar8;
            local_40[10] = 0x10000;
            local_40[0xb] = 0;
            local_40[0xc] = 0;
            local_40[0xd] = 0x10000;
            local_40[0xe] = 0;
            local_40[0xf] = 0;
            local_58->other = local_40;
            return 0;
          }
          uVar15 = uVar14 + 1;
        }
      } while (uVar15 <= uVar12);
    }
    FVar9 = 0x10;
  }
  return FVar9;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_svg_doc( FT_GlyphSlot  glyph,
                        FT_UInt       glyph_index )
  {
    FT_Error   error  = FT_Err_Ok;
    TT_Face    face   = (TT_Face)glyph->face;
    FT_Memory  memory = face->root.memory;
    Svg*       svg    = (Svg*)face->svg;

    FT_Byte*  doc_list;
    FT_ULong  doc_limit;

    FT_Byte*   doc;
    FT_ULong   doc_offset;
    FT_ULong   doc_length;
    FT_UShort  doc_start_glyph_id;
    FT_UShort  doc_end_glyph_id;

    FT_SVG_Document  svg_document = (FT_SVG_Document)glyph->other;


    FT_ASSERT( !( svg == NULL ) );

    doc_list = svg->svg_doc_list;

    error = find_doc( doc_list + 2, svg->num_entries, glyph_index,
                                    &doc_offset, &doc_length,
                                    &doc_start_glyph_id, &doc_end_glyph_id );
    if ( error != FT_Err_Ok )
      goto Exit;

    doc_limit = svg->table_size -
                  (FT_ULong)( doc_list - (FT_Byte*)svg->table );
    if ( doc_offset > doc_limit              ||
         doc_length > doc_limit - doc_offset )
    {
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    doc = doc_list + doc_offset;

    if ( doc_length > 6 &&
         doc[0] == 0x1F &&
         doc[1] == 0x8B &&
         doc[2] == 0x08 )
    {
#ifdef FT_CONFIG_OPTION_USE_ZLIB

      FT_ULong  uncomp_size;
      FT_Byte*  uncomp_buffer = NULL;


      /*
       * Get the size of the original document.  This helps in allotting the
       * buffer to accommodate the uncompressed version.  The last 4 bytes
       * of the compressed document are equal to the original size modulo
       * 2^32.  Since the size of SVG documents is less than 2^32 bytes we
       * can use this accurately.  The four bytes are stored in
       * little-endian format.
       */
      FT_TRACE4(( "SVG document is GZIP compressed\n" ));
      uncomp_size = (FT_ULong)doc[doc_length - 1] << 24 |
                    (FT_ULong)doc[doc_length - 2] << 16 |
                    (FT_ULong)doc[doc_length - 3] << 8  |
                    (FT_ULong)doc[doc_length - 4];

      if ( FT_QALLOC( uncomp_buffer, uncomp_size ) )
        goto Exit;

      error = FT_Gzip_Uncompress( memory,
                                  uncomp_buffer,
                                  &uncomp_size,
                                  doc,
                                  doc_length );
      if ( error )
      {
        FT_FREE( uncomp_buffer );
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      glyph->internal->flags |= FT_GLYPH_OWN_GZIP_SVG;

      doc        = uncomp_buffer;
      doc_length = uncomp_size;

#else /* !FT_CONFIG_OPTION_USE_ZLIB */

      error = FT_THROW( Unimplemented_Feature );
      goto Exit;

#endif /* !FT_CONFIG_OPTION_USE_ZLIB */
    }

    svg_document->svg_document        = doc;
    svg_document->svg_document_length = doc_length;

    svg_document->metrics      = glyph->face->size->metrics;
    svg_document->units_per_EM = glyph->face->units_per_EM;

    svg_document->start_glyph_id = doc_start_glyph_id;
    svg_document->end_glyph_id   = doc_end_glyph_id;

    svg_document->transform.xx = 0x10000;
    svg_document->transform.xy = 0;
    svg_document->transform.yx = 0;
    svg_document->transform.yy = 0x10000;

    svg_document->delta.x = 0;
    svg_document->delta.y = 0;

    FT_TRACE5(( "start_glyph_id: %d\n", doc_start_glyph_id ));
    FT_TRACE5(( "end_glyph_id:   %d\n", doc_end_glyph_id ));
    FT_TRACE5(( "svg_document:\n" ));
    FT_TRACE5(( " %.*s\n", (FT_UInt)doc_length, doc ));

    glyph->other = svg_document;

  Exit:
    return error;
  }